

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O3

void daif_check(CPUARMState_conflict *env,uint32_t op,uint32_t imm,uintptr_t ra)

{
  uint uVar1;
  uint32_t target_el;
  uint64_t uVar2;
  
  if ((env->features & 0x200) == 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) != 0x10) {
        return;
      }
      goto LAB_0060c5f8;
    }
    uVar1 = env->pstate >> 2 & 3;
  }
  else {
    if ((env->v7m).exception != 0) {
      return;
    }
    uVar1 = ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  if (uVar1 != 0) {
    return;
  }
LAB_0060c5f8:
  uVar2 = arm_sctlr_aarch64(env,0);
  if (((uint)uVar2 >> 9 & 1) != 0) {
    return;
  }
  target_el = exception_target_el(env);
  raise_exception_ra_aarch64(env,1,(op & 0x3f) << 0xe | imm * 2 | 0x620013e0,target_el,ra);
}

Assistant:

static void daif_check(CPUARMState *env, uint32_t op,
                       uint32_t imm, uintptr_t ra)
{
    /* DAIF update to PSTATE. This is OK from EL0 only if UMA is set.  */
    if (arm_current_el(env) == 0 && !(arm_sctlr(env, 0) & SCTLR_UMA)) {
        raise_exception_ra(env, EXCP_UDEF,
                           syn_aa64_sysregtrap(0, extract32(op, 0, 3),
                                               extract32(op, 3, 3), 4,
                                               imm, 0x1f, 0),
                           exception_target_el(env), ra);
    }
}